

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O3

int * f3_get_stem_contributions_d0
                (vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  int *piVar1;
  long lVar2;
  int *piVar3;
  uint j;
  vrna_param_t *pvVar4;
  code *pcVar5;
  code *pcVar6;
  uchar uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  long lVar13;
  void *__ptr;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined4 in_register_00000034;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  char *pcVar23;
  ulong local_d8;
  char **local_a0;
  
  j = fc->length;
  lVar18 = (long)(int)j;
  iVar11 = fc->window_size;
  pvVar4 = fc->params;
  lVar15 = (long)i;
  lVar16 = *(long *)((fc->matrices->field_2).field_0.c + lVar15 * 2);
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    local_a0 = fc->ptype_local;
    local_d8 = 1;
    pcVar23 = (char *)0x0;
  }
  else {
    local_d8 = (ulong)(fc->field_23).field_1.n_seq;
    pcVar23 = (fc->field_23).field_0.ptype_pf_compat;
    local_a0 = (char **)0x0;
  }
  lVar14 = lVar16 + lVar15 * -4;
  iVar22 = (pvVar4->model_details).min_loop_size;
  pvVar12 = vrna_alloc(iVar11 * 4 + 0x18);
  piVar1 = (int *)((long)pvVar12 + lVar15 * -4);
  pcVar5 = (code *)sc_wrapper->red_stem;
  pcVar6 = (code *)sc_wrapper->decomp_stem;
  uVar20 = iVar11 + i;
  uVar10 = j - 1;
  if (uVar20 <= j - 1) {
    uVar10 = uVar20;
  }
  iVar11 = (int)local_d8;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    __ptr = vrna_alloc(iVar11 * 2);
    if (iVar11 != 0) {
      uVar19 = 0;
      do {
        *(undefined2 *)((long)__ptr + uVar19 * 2) =
             *(undefined2 *)(*(long *)(pcVar23 + uVar19 * 8) + lVar15 * 2);
        uVar19 = uVar19 + 1;
      } while (local_d8 != uVar19);
    }
    if (i + iVar22 < (int)uVar10) {
      lVar16 = (long)(i + iVar22);
      do {
        lVar17 = lVar16 + 1;
        piVar1[lVar16 + 1] = 10000000;
        if ((*(int *)(lVar14 + 4 + lVar16 * 4) != 10000000) &&
           (uVar7 = (*evaluate)(i,j,(int)lVar17,(int)lVar16 + 2,'\x10',hc_dat_local), uVar7 != '\0')
           ) {
          iVar8 = *(int *)(lVar14 + lVar17 * 4);
          if (iVar11 != 0) {
            uVar19 = 0;
            do {
              uVar9 = vrna_get_ptype_md((int)*(short *)((long)__ptr + uVar19 * 2),
                                        (int)*(short *)(*(long *)(pcVar23 + uVar19 * 8) + lVar17 * 2
                                                       ),&pvVar4->model_details);
              iVar21 = 0;
              if (2 < uVar9) {
                iVar21 = pvVar4->TerminalAU;
              }
              iVar8 = iVar8 + iVar21;
              uVar19 = uVar19 + 1;
            } while (local_d8 != uVar19);
          }
          piVar1[lVar17] = iVar8;
        }
        lVar16 = lVar17;
      } while (lVar17 < (int)uVar10);
    }
  }
  else if ((fc->type == VRNA_FC_TYPE_SINGLE) && (iVar8 = i + iVar22, iVar8 < (int)uVar10)) {
    lVar13 = (long)iVar8 * 4 + lVar15 * -4;
    lVar17 = lVar13 + 4;
    lVar13 = lVar16 + lVar13 + 4;
    __ptr = (void *)0x0;
    lVar16 = 0;
    do {
      *(undefined4 *)((long)pvVar12 + lVar16 * 4 + lVar17) = 10000000;
      if (*(int *)(lVar13 + lVar16 * 4) != 10000000) {
        iVar21 = iVar8 + (int)lVar16 + 1;
        uVar7 = (*evaluate)(i,j,iVar21,iVar8 + 2 + (int)lVar16,'\x10',hc_dat_local);
        if (uVar7 != '\0') {
          uVar9 = vrna_get_ptype_window(i,iVar21,local_a0);
          iVar21 = 0;
          if (2 < uVar9) {
            iVar21 = pvVar4->TerminalAU;
          }
          *(int *)((long)pvVar12 + lVar16 * 4 + lVar17) = iVar21 + *(int *)(lVar13 + lVar16 * 4);
        }
      }
      lVar2 = lVar16 + iVar8;
      lVar16 = lVar16 + 1;
    } while (lVar2 + 1 < (long)(int)uVar10);
  }
  else {
    __ptr = (void *)0x0;
  }
  if ((pcVar6 != (code *)0x0) && (i + iVar22 < (int)uVar10)) {
    lVar17 = (long)(i + iVar22);
    iVar22 = iVar22 + i + 2;
    lVar16 = lVar15 * -4 + 4;
    do {
      if (*(int *)((long)pvVar12 + lVar17 * 4 + lVar16) != 10000000) {
        iVar8 = (*pcVar6)(CONCAT44(in_register_00000034,i),iVar22 + -1,iVar22,sc_wrapper);
        piVar3 = (int *)((long)pvVar12 + lVar17 * 4 + lVar16);
        *piVar3 = *piVar3 + iVar8;
      }
      lVar17 = lVar17 + 1;
      iVar22 = iVar22 + 1;
    } while (lVar17 < (int)uVar10);
  }
  if (uVar20 < j) {
    piVar1[(long)(int)uVar20 + 1] = 10000000;
  }
  else {
    piVar1[lVar18] = 10000000;
    if ((*(int *)(lVar14 + lVar18 * 4) != 10000000) &&
       (uVar7 = (*evaluate)(i,j,i,j,'\x0e',hc_dat_local), uVar7 != '\0')) {
      iVar22 = *(int *)(lVar14 + lVar18 * 4);
      if (fc->type == VRNA_FC_TYPE_SINGLE) {
        uVar10 = vrna_get_ptype_window(i,j,local_a0);
        iVar11 = 0;
        if (2 < uVar10) {
          iVar11 = pvVar4->TerminalAU;
        }
        iVar22 = iVar22 + iVar11;
      }
      else if ((fc->type == VRNA_FC_TYPE_COMPARATIVE) && (iVar11 != 0)) {
        uVar19 = 0;
        do {
          uVar10 = vrna_get_ptype_md((int)*(short *)((long)__ptr + uVar19 * 2),
                                     (int)*(short *)(*(long *)(pcVar23 + uVar19 * 8) + lVar18 * 2),
                                     &pvVar4->model_details);
          iVar11 = 0;
          if (2 < uVar10) {
            iVar11 = pvVar4->TerminalAU;
          }
          iVar22 = iVar22 + iVar11;
          uVar19 = uVar19 + 1;
        } while (local_d8 != uVar19);
      }
      if (pcVar5 != (code *)0x0) {
        iVar11 = (*pcVar5)(CONCAT44(in_register_00000034,i),i,j,sc_wrapper);
        iVar22 = iVar22 + iVar11;
      }
      piVar1[lVar18] = iVar22;
    }
  }
  free(__ptr);
  return piVar1;
}

Assistant:

int *
f3_get_stem_contributions_d0(vrna_fold_compound_t       *fc,
                             int                        i,
                             vrna_callback_hc_evaluate  *evaluate,
                             struct default_data        *hc_dat_local,
                             struct sc_wrapper_f3       *sc_wrapper)
{
  char                    **ptype;
  short                   **S, *si;
  unsigned int            s, n_seq, type, length;
  int                     energy, j, max_j, turn, *c, *stems, maxdist;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f3_split_in_ext_stem *sc_spl_stem;
  sc_f3_reduce_to_stem    *sc_red_stem;

  length  = fc->length;
  maxdist = fc->window_size;
  P       = fc->params;
  md      = &(P->model_details);
  c       = fc->matrices->c_local[i];
  c       -= i;
  turn    = md->min_loop_size;
  si      = NULL;
  ptype   = (fc->type == VRNA_FC_TYPE_SINGLE) ? fc->ptype_local : NULL;
  n_seq   = (fc->type == VRNA_FC_TYPE_SINGLE) ? 1 : fc->n_seq;
  S       = (fc->type == VRNA_FC_TYPE_SINGLE) ? NULL : fc->S;

  stems = (int *)vrna_alloc(sizeof(int) * (maxdist + 6));
  stems -= i;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  max_j = MIN2(length - 1, i + maxdist);

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          type      = vrna_get_ptype_window(i, j, ptype);
          stems[j]  = c[j] +
                      vrna_E_ext_stem(type, -1, -1, P);
        }
      }
      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      si = (short *)vrna_alloc(sizeof(short) * n_seq);

      for (s = 0; s < n_seq; s++)
        si[s] = S[s][i];

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          energy = c[j];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j], md);
            energy  += vrna_E_ext_stem(type, -1, -1, P);
          }
          stems[j] = energy;
        }
      }
      break;
  }


  if (sc_spl_stem)
    for (j = i + turn + 1; j <= max_j; j++)
      if (stems[j] != INF)
        stems[j] += sc_spl_stem(i, j, j + 1, sc_wrapper);

  if (length <= i + maxdist) {
    j         = length;
    stems[j]  = INF;

    if ((c[j] != INF) &&
        (evaluate(i, j, i, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
      energy = c[j];

      switch (fc->type) {
        case VRNA_FC_TYPE_SINGLE:
          type    = vrna_get_ptype_window(i, j, ptype);
          energy  += vrna_E_ext_stem(type, -1, -1, P);

          break;

        case VRNA_FC_TYPE_COMPARATIVE:
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j], md);
            energy  += vrna_E_ext_stem(type, -1, -1, P);
          }

          break;
      }

      if (sc_red_stem)
        energy += sc_red_stem(i, i, j, sc_wrapper);

      stems[j] = energy;
    }
  } else {
    /*
     * make sure we do not take (i + maxdist + 1) into account when
     * decomposing for odd dangle models
     */
    stems[i + maxdist + 1] = INF;
  }

  free(si);

  return stems;
}